

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

pair<const_int_*,_bool> __thiscall
HighsHashTree<int,_void>::InnerLeaf<1>::insert_entry
          (InnerLeaf<1> *this,uint64_t fullHash,int hashPos,Entry *entry)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  HighsHashTableEntry<int,_void> *pHVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong uVar10;
  unsigned_long *puVar11;
  pair<const_int_*,_bool> pVar12;
  uint16_t hash;
  uint local_1c;
  
  uVar10 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  hash = (uint16_t)uVar10;
  bVar2 = (byte)(uVar10 >> 10);
  uVar8 = (this->occupation).occupation;
  uVar7 = POPCOUNT(uVar8 >> (bVar2 & 0x3f));
  local_1c = (uint)uVar7;
  if ((uVar8 >> (uVar10 >> 10 & 0x3f) & 1) == 0) {
    (this->occupation).occupation = uVar8 | 1L << (bVar2 & 0x3f);
    iVar4 = this->size;
    if ((int)local_1c < iVar4) {
      puVar11 = (this->hashes)._M_elems + uVar7;
      uVar7 = (ulong)(local_1c - 1);
      do {
        local_1c = (int)uVar7 + 1;
        uVar7 = (ulong)local_1c;
        uVar8 = *puVar11;
        puVar11 = puVar11 + 1;
      } while ((uVar10 & 0xffff) < uVar8);
    }
  }
  else {
    do {
      uVar8 = uVar7 + 1;
      lVar1 = uVar7 - 1;
      uVar7 = uVar8;
    } while ((uVar10 & 0xffff) < (this->hashes)._M_elems[lVar1]);
    local_1c = (int)uVar8 - 2;
    bVar3 = find_key(this,&entry->value_,&hash,(int *)&local_1c);
    uVar7 = (ulong)local_1c;
    if (bVar3) {
      pHVar5 = (this->entries)._M_elems + (int)local_1c;
      uVar9 = 0;
      goto LAB_002854ed;
    }
    iVar4 = this->size;
  }
  uVar6 = (uint)uVar7;
  if ((int)(uint)uVar7 < iVar4) {
    move_backward(this,(int *)&local_1c,&this->size);
    uVar6 = local_1c;
  }
  pHVar5 = (this->entries)._M_elems + (int)uVar6;
  pHVar5->value_ = entry->value_;
  (this->hashes)._M_elems[(int)uVar6] = (ulong)hash;
  iVar4 = this->size;
  lVar1 = (long)iVar4 + 1;
  this->size = (int)lVar1;
  (this->hashes)._M_elems[(long)iVar4 + 1] = 0;
  uVar9 = CONCAT71((int7)((ulong)lVar1 >> 8),1);
LAB_002854ed:
  pVar12._8_8_ = uVar9;
  pVar12.first = &pHVar5->value_;
  return pVar12;
}

Assistant:

std::pair<ValueType*, bool> insert_entry(uint64_t fullHash, int hashPos,
                                             Entry& entry) {
      assert(size < capacity());
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);

      int pos = occupation.num_set_until(hashChunk);

      if (occupation.test(hashChunk)) {
        // since the occupation flag is set we need to start searching from
        // pos-1 and can rely on a hash chunk with the same value existing for
        // the scan
        --pos;
        while (hashes[pos] > hash) ++pos;

        if (find_key(entry.key(), hash, pos))
          return std::make_pair(&entries[pos].value(), false);

      } else {
        occupation.set(hashChunk);

        if (pos < size)
          while (hashes[pos] > hash) ++pos;
      }

      if (pos < size) move_backward(pos, size);
      entries[pos] = std::move(entry);
      hashes[pos] = hash;
      ++size;
      hashes[size] = 0;

      return std::make_pair(&entries[pos].value(), true);
    }